

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

GLenum switch_rasterizer_with_mode
                 (bov_window_t *window,bov_points_t *points,bov_points_drawing_mode_t mode)

{
  uint uVar1;
  GLuint GVar2;
  GLenum extraout_EAX;
  GLenum GVar3;
  GLenum extraout_EAX_00;
  GLuint *in_RCX;
  bov_points_drawing_mode_t mode_00;
  int in_R8D;
  GLenum in_R9D;
  
  if (mode < (FAST_TRIANGLE_FAN_PROGRAM|LINES_PROGRAM)) {
    uVar1 = *(uint *)(&DAT_00183e30 + (ulong)mode * 4);
    GVar3 = *(GLenum *)(&DAT_00183e6c + (ulong)mode * 4);
    if (window->last_program != uVar1) {
      (*glad_glUseProgram)(window->program[uVar1]);
      window->last_program = uVar1;
    }
    (*glad_glBindBuffer)(0x8a11,window->ubo[1]);
    (*glad_glBufferSubData)(0x8a11,0,0x40,&points->param);
    (*glad_glBindVertexArray)(points->vao);
    return GVar3;
  }
  switch_rasterizer_with_mode_cold_1();
  if (in_RCX != (GLuint *)0x0) {
    GVar3 = extraout_EAX;
    if (points->vboLen != 0) {
      GVar2 = in_RCX[2];
      GVar3 = GVar2 - in_R8D;
      if (GVar3 != 0 && in_R8D <= (int)GVar2) {
        if ((int)GVar2 < (int)(in_R9D + in_R8D)) {
          in_R9D = GVar3;
        }
        if (in_R8D < 0) {
          in_R9D = GVar3;
        }
        GVar3 = switch_rasterizer_with_mode(window,points,mode_00);
        (*glad_glBindBuffer)(0x8893,*in_RCX);
        GVar3 = (*glad_glDrawElements)(GVar3,in_R9D,0x1405,(void *)((long)in_R8D << 2));
        return GVar3;
      }
    }
    return GVar3;
  }
  bov_points_draw_aux(window,points,mode_00,in_R8D,in_R9D);
  return extraout_EAX_00;
}

Assistant:

static GLenum switch_rasterizer_with_mode(bov_window_t* window,
                                          const bov_points_t* points,
                                          bov_points_drawing_mode_t mode)
{
	int program_index;
	GLenum primitive = 0;

	switch(mode) {
		case POINTS_PROGRAM:
			program_index = POINTS_PROGRAM_INDEX;
			primitive = GL_POINTS;
			break;
		case LINES_PROGRAM:
			program_index = LINES_PROGRAM_INDEX;
			primitive = GL_LINES;
			break;
		case LINE_LOOP_PROGRAM:
			program_index = LINES_PROGRAM_INDEX;
			primitive = GL_LINE_LOOP;
			break;
		case LINE_STRIP_PROGRAM:
			program_index = LINES_PROGRAM_INDEX;
			primitive = GL_LINE_STRIP;
			break;
		case CURVE_PROGRAM:
			program_index = CURVE_PROGRAM_INDEX;
			primitive = GL_LINE_STRIP_ADJACENCY;
			break;
		case TRIANGLES_PROGRAM:
			program_index = TRIANGLES_PROGRAM_INDEX;
			primitive = GL_TRIANGLES;
			break;
		case TRIANGLE_STRIP_PROGRAM:
			program_index = TRIANGLES_PROGRAM_INDEX;
			primitive = GL_TRIANGLE_STRIP;
			break;
		case TRIANGLE_FAN_PROGRAM:
			program_index = TRIANGLES_PROGRAM_INDEX;
			primitive = GL_TRIANGLE_FAN;
			break;
		// case QUADS_PROGRAM:
		// 	program_index = QUAD_PROGRAM_INDEX;
		// 	primitive = GL_LINES_ADJACENCY;
		// 	break;
		case FAST_POINTS_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_POINTS;
			break;
		case FAST_LINES_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_LINES;
			break;
		case FAST_LINE_LOOP_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_LINE_LOOP;
			break;
		case FAST_LINE_STRIP_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_LINE_STRIP;
			break;
		case FAST_TRIANGLES_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_TRIANGLES;
			break;
		case FAST_TRIANGLE_STRIP_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_TRIANGLE_STRIP;
			break;
		case FAST_TRIANGLE_FAN_PROGRAM:
			program_index = DEFAULT_PROGRAM_INDEX;
			primitive = GL_TRIANGLE_FAN;
			break;
		default:
			BOV_ERROR_LOG(BOV_PARAMETER_ERROR,
			              "this function is private but was "
			              "given erroneous arguments anyway");
			exit(EXIT_FAILURE);
	}

	if(window->last_program!=program_index) {
		glUseProgram(window->program[program_index]);
		window->last_program = program_index;
	}

	// update the object ubo
	glBindBuffer(GL_UNIFORM_BUFFER, window->ubo[1]);
	glBufferSubData(GL_UNIFORM_BUFFER,
	                0,
	                sizeof(bov_points_param_t),
	                &points->param);
	// glBindBuffer(GL_UNIFORM_BUFFER, 0);

	glBindVertexArray(points->vao);

	return primitive;
}